

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Layer *pLVar2;
  Allocator *pAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  undefined4 uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  Option *opt_00;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  Mat local_158;
  Mat *local_120;
  Option *local_118;
  void *local_110;
  int *local_108;
  Option *local_100;
  Allocator *local_f8;
  undefined4 local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  ulong local_e0;
  Option opt_g_1;
  Option opt_g;
  Mat local_70;
  Option *local_38;
  
  iVar1 = bottom_blob->c;
  iVar17 = (this->super_ConvolutionDepthWise).group;
  if (iVar1 % iVar17 != 0) {
    return -100;
  }
  if ((this->super_ConvolutionDepthWise).num_output % iVar17 != 0) {
    return -100;
  }
  iVar17 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  opt_00 = (Option *)bottom_blob->elemsize;
  uVar11 = ((this->super_ConvolutionDepthWise).kernel_w + -1) *
           (this->super_ConvolutionDepthWise).dilation_w;
  uVar8 = ((this->super_ConvolutionDepthWise).kernel_h + -1) *
          (this->super_ConvolutionDepthWise).dilation_h;
  local_70.data = bottom_blob->data;
  local_70.refcount = bottom_blob->refcount;
  local_70.allocator = bottom_blob->allocator;
  local_70.dims = bottom_blob->dims;
  local_70.w = iVar17;
  local_70.h = iVar15;
  local_70.c = iVar1;
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + 1;
    UNLOCK();
    local_70.w = bottom_blob->w;
    local_70.h = bottom_blob->h;
    local_70.c = bottom_blob->c;
  }
  local_70.cstep = bottom_blob->cstep;
  local_120 = top_blob;
  local_118 = opt;
  local_70.elemsize = (size_t)opt_00;
  if ((opt_00 != (Option *)0x1 & (this->super_ConvolutionDepthWise).use_int8_inference) == 1) {
    local_158.allocator = opt->workspace_allocator;
    local_158.data = (void *)0x0;
    local_158.refcount = (int *)0x0;
    local_158.elemsize = 1;
    local_158.dims = 3;
    local_158.c = iVar1;
    local_158.h = iVar15;
    local_158.cstep = (long)(iVar15 * iVar17) + 0xfU & 0xfffffffffffffff0;
    uVar13 = local_158.cstep * (long)iVar1;
    local_158.w = iVar17;
    if (uVar13 == 0) {
      iVar17 = -100;
      goto LAB_0012681f;
    }
    local_38 = opt_00;
    if (local_158.allocator == (Allocator *)0x0) {
      pvVar10 = malloc(uVar13 + 0x1c);
      local_158.data = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)local_158.data - 8) = pvVar10;
    }
    else {
      local_158.data =
           (void *)(*(code *)**(undefined8 **)local_158.allocator)(local_158.allocator,uVar13 | 4);
    }
    local_158.refcount = (int *)((long)local_158.data + uVar13);
    *(undefined4 *)((long)local_158.data + uVar13) = 1;
    iVar16 = (this->super_ConvolutionDepthWise).group;
    iVar9 = iVar1 / iVar16;
    if (iVar16 < 1) {
LAB_00125efb:
      LOCK();
      *local_158.refcount = *local_158.refcount + 1;
      UNLOCK();
    }
    else {
      lVar18 = 0;
      lVar14 = 0;
      do {
        pAVar3 = local_158.allocator;
        uVar5._0_1_ = local_118->lightmode;
        uVar5._1_3_ = *(undefined3 *)&local_118->field_0x1;
        uVar5._4_4_ = local_118->num_threads;
        opt_g.workspace_allocator = local_118->workspace_allocator;
        opt_g._0_4_ = SUB84(uVar5,0);
        opt_g.num_threads = 1;
        opt_g.blob_allocator = local_158.allocator;
        local_ec = bottom_blob->w;
        local_e8 = bottom_blob->h;
        local_100 = (Option *)bottom_blob->elemsize;
        local_110 = (void *)(bottom_blob->cstep * lVar18 * (long)local_100 + (long)bottom_blob->data
                            );
        local_f8 = bottom_blob->allocator;
        local_108 = (int *)0x0;
        local_f0 = 3;
        local_e0 = ((long)(local_e8 * local_ec) * (long)local_100 + 0xfU & 0xfffffffffffffff0) /
                   (ulong)local_100;
        opt_g_1._0_8_ = local_158.cstep * lVar18 * local_158.elemsize + (long)local_158.data;
        opt_g_1.blob_allocator = (Allocator *)0x0;
        opt_g_1.workspace_allocator = (Allocator *)local_158.elemsize;
        pLVar2 = (this->super_ConvolutionDepthWise).quantize_ops.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        local_e4 = iVar9;
        (*pLVar2->_vptr_Layer[5])(pLVar2,&local_110,&opt_g_1,&opt_g);
        if (opt_g_1.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)opt_g_1.blob_allocator = *(int *)opt_g_1.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_g_1.blob_allocator == 0) {
            if (pAVar3 == (Allocator *)0x0) {
              if (opt_g_1._0_8_ != 0) {
                free(*(void **)(opt_g_1._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 8))();
            }
          }
        }
        if (local_108 != (int *)0x0) {
          LOCK();
          *local_108 = *local_108 + -1;
          UNLOCK();
          if (*local_108 == 0) {
            if (local_f8 == (Allocator *)0x0) {
              if (local_110 != (void *)0x0) {
                free(*(void **)((long)local_110 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_f8 + 8))();
            }
          }
        }
        lVar14 = lVar14 + 1;
        lVar18 = lVar18 + iVar9;
      } while (lVar14 < (this->super_ConvolutionDepthWise).group);
      opt = local_118;
      top_blob = local_120;
      if (local_158.refcount != (int *)0x0) goto LAB_00125efb;
    }
    opt_00 = local_38;
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + -1;
      UNLOCK();
      if (*local_70.refcount == 0) {
        if (local_70.allocator == (Allocator *)0x0) {
          if (local_70.data != (void *)0x0) {
            free(*(void **)((long)local_70.data - 8));
          }
        }
        else {
          (**(code **)(*(long *)local_70.allocator + 8))();
        }
      }
    }
    local_70.data = local_158.data;
    local_70.refcount = local_158.refcount;
    local_70.elemsize = local_158.elemsize;
    local_70.allocator = local_158.allocator;
    local_70.dims = local_158.dims;
    local_70.w = local_158.w;
    local_70.h = local_158.h;
    local_70.c = local_158.c;
    local_70.cstep = local_158.cstep;
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(*(void **)((long)local_158.data - 8));
          }
        }
        else {
          (**(code **)(*(long *)local_158.allocator + 8))();
        }
      }
    }
  }
  local_158.data = local_70.data;
  local_158.refcount = local_70.refcount;
  local_158.elemsize = local_70.elemsize;
  local_158.allocator = local_70.allocator;
  local_158.dims = local_70.dims;
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + 1;
    UNLOCK();
  }
  local_158.w = local_70.w;
  local_158.h = local_70.h;
  local_158.c = local_70.c;
  local_158.cstep = local_70.cstep;
  iVar16 = (this->super_ConvolutionDepthWise).pad_w;
  iVar9 = (this->super_ConvolutionDepthWise).pad_h;
  if (iVar9 < 1 && iVar16 < 1) {
    if (iVar9 == -0xe9 && iVar16 == -0xe9) {
      iVar16 = uVar11 - (iVar17 + -1) % (this->super_ConvolutionDepthWise).stride_w;
      iVar17 = uVar8 - (iVar15 + -1) % (this->super_ConvolutionDepthWise).stride_h;
      if ((0 < iVar16) || (0 < iVar17)) {
        copy_make_border(&local_70,&local_158,iVar17 / 2,iVar17 - iVar17 / 2,iVar16 / 2,
                         iVar16 - iVar16 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        goto LAB_00126068;
      }
      iVar15 = local_70.h;
      iVar17 = local_70.w;
    }
LAB_0012610c:
    Mat::create(top_blob,(int)(~uVar11 + iVar17) / (this->super_ConvolutionDepthWise).stride_w + 1,
                (int)(~uVar8 + iVar15) / (this->super_ConvolutionDepthWise).stride_h + 1,
                (this->super_ConvolutionDepthWise).num_output,(size_t)opt_00,opt->blob_allocator);
    iVar17 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar17 = (this->super_ConvolutionDepthWise).num_output;
      iVar15 = (this->super_ConvolutionDepthWise).group;
      if (iVar15 != iVar17 || iVar1 != iVar15) {
        if (0 < iVar15) {
          lVar14 = 0;
          lVar18 = 0;
          lVar19 = 0;
          do {
            local_110 = (void *)(local_158.cstep * lVar14 * local_158.elemsize +
                                (long)local_158.data);
            local_108 = (int *)0x0;
            local_100 = (Option *)local_158.elemsize;
            local_f8 = local_158.allocator;
            local_f0 = 3;
            local_ec = local_158.w;
            local_e8 = local_158.h;
            local_e0 = ((long)(local_158.h * local_158.w) * local_158.elemsize + 0xf &
                       0xfffffffffffffff0) / local_158.elemsize;
            opt_g_1.workspace_allocator = (Allocator *)local_120->elemsize;
            pAVar3 = local_120->allocator;
            opt_g_1._0_8_ =
                 local_120->cstep * lVar18 * (long)opt_g_1.workspace_allocator +
                 (long)local_120->data;
            opt_g_1.blob_allocator = (Allocator *)0x0;
            pLVar2 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar19];
            opt_g.lightmode = local_118->lightmode;
            opt_g._1_3_ = *(undefined3 *)&local_118->field_0x1;
            opt_g.num_threads = local_118->num_threads;
            opt_g.workspace_allocator = local_118->workspace_allocator;
            local_e4 = iVar1 / iVar15;
            opt_g.blob_allocator = pAVar3;
            (*pLVar2->_vptr_Layer[5])(pLVar2,&local_110,&opt_g_1,&opt_g);
            if (opt_g_1.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)opt_g_1.blob_allocator = *(int *)opt_g_1.blob_allocator + -1;
              UNLOCK();
              if (*(int *)opt_g_1.blob_allocator == 0) {
                if (pAVar3 == (Allocator *)0x0) {
                  if (opt_g_1._0_8_ != 0) {
                    free(*(void **)(opt_g_1._0_8_ + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAVar3 + 8))();
                }
              }
            }
            if (local_108 != (int *)0x0) {
              LOCK();
              *local_108 = *local_108 + -1;
              UNLOCK();
              if (*local_108 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (local_110 != (void *)0x0) {
                    free(*(void **)((long)local_110 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)local_f8 + 8))();
                }
              }
            }
            lVar19 = lVar19 + 1;
            lVar18 = lVar18 + iVar17 / iVar15;
            lVar14 = lVar14 + iVar1 / iVar15;
          } while (lVar19 < (this->super_ConvolutionDepthWise).group);
        }
        goto LAB_001267e8;
      }
      auVar20._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
      auVar20._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
      auVar20._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
      auVar20._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
      uVar12 = movmskps(iVar17,auVar20);
      bVar7 = (byte)uVar12;
      bVar7 = bVar7 >> 1 & bVar7 & bVar7 >> 2 & (bVar7 & 8) >> 3;
      if ((this->super_ConvolutionDepthWise).use_int8_inference == true) {
        if (bVar7 == 0) {
LAB_00126606:
          if (0 < iVar1) {
            lVar14 = 0;
            do {
              local_110 = (void *)(local_158.cstep * lVar14 * local_158.elemsize +
                                  (long)local_158.data);
              local_108 = (int *)0x0;
              local_100 = (Option *)local_158.elemsize;
              local_f8 = local_158.allocator;
              local_f0 = 3;
              local_ec = local_158.w;
              local_e8 = local_158.h;
              local_e4 = 1;
              local_e0 = ((long)(local_158.h * local_158.w) * local_158.elemsize + 0xf &
                         0xfffffffffffffff0) / local_158.elemsize;
              opt_g_1.workspace_allocator = (Allocator *)local_120->elemsize;
              opt_g_1._0_8_ =
                   local_120->cstep * lVar14 * (long)opt_g_1.workspace_allocator +
                   (long)local_120->data;
              pAVar3 = local_120->allocator;
              opt_g_1.blob_allocator = (Allocator *)0x0;
              pLVar2 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
              uVar4._0_1_ = local_118->lightmode;
              uVar4._1_3_ = *(undefined3 *)&local_118->field_0x1;
              uVar4._4_4_ = local_118->num_threads;
              opt_g.workspace_allocator = local_118->workspace_allocator;
              opt_g._0_4_ = SUB84(uVar4,0);
              opt_g.num_threads = 1;
              opt_g.blob_allocator = pAVar3;
              (*pLVar2->_vptr_Layer[5])(pLVar2,&local_110,&opt_g_1,&opt_g);
              if (opt_g_1.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)opt_g_1.blob_allocator = *(int *)opt_g_1.blob_allocator + -1;
                UNLOCK();
                if (*(int *)opt_g_1.blob_allocator == 0) {
                  if (pAVar3 == (Allocator *)0x0) {
                    if (opt_g_1._0_8_ != 0) {
                      free(*(void **)(opt_g_1._0_8_ + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)pAVar3 + 8))();
                  }
                }
              }
              if (local_108 != (int *)0x0) {
                LOCK();
                *local_108 = *local_108 + -1;
                UNLOCK();
                if (*local_108 == 0) {
                  if (local_f8 == (Allocator *)0x0) {
                    if (local_110 != (void *)0x0) {
                      free(*(void **)((long)local_110 + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_f8 + 8))();
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (this->super_ConvolutionDepthWise).group);
          }
        }
        else {
          uVar8 = (this->super_ConvolutionDepthWise).stride_w;
          uVar11 = (this->super_ConvolutionDepthWise).stride_h;
          if (uVar11 == 1 && uVar8 == 1) {
            convdw3x3s1_int8_sse
                      (&local_158,local_120,
                       (Mat *)(this->super_ConvolutionDepthWise).weight_data.data,
                       (Option *)(ulong)uVar11);
          }
          else {
            uVar8 = uVar11 ^ 2 | uVar8 ^ 2;
            if (uVar8 != 0) goto LAB_00126606;
            convdw3x3s2_int8_sse
                      (&local_158,local_120,
                       (Mat *)(this->super_ConvolutionDepthWise).weight_data.data,
                       (Option *)(ulong)uVar8);
          }
          if (0 < (this->super_ConvolutionDepthWise).group) {
            lVar14 = 0;
            iVar17 = 0;
            do {
              uVar6._0_1_ = local_118->lightmode;
              uVar6._1_3_ = *(undefined3 *)&local_118->field_0x1;
              uVar6._4_4_ = local_118->num_threads;
              opt_g_1.workspace_allocator = local_118->workspace_allocator;
              opt_g_1._0_4_ = SUB84(uVar6,0);
              opt_g_1.num_threads = 1;
              local_f8 = local_120->allocator;
              local_ec = local_120->w;
              local_e8 = local_120->h;
              local_100 = (Option *)local_120->elemsize;
              local_110 = (void *)(local_120->cstep * lVar14 * (long)local_100 +
                                  (long)local_120->data);
              local_108 = (int *)0x0;
              local_f0 = 2;
              local_e4 = 1;
              local_e0 = (ulong)(local_e8 * local_ec);
              pLVar2 = (this->super_ConvolutionDepthWise).dequantize_ops.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
              opt_g_1.blob_allocator = local_f8;
              (*pLVar2->_vptr_Layer[7])(pLVar2,&local_110,&opt_g_1);
              if (local_108 != (int *)0x0) {
                LOCK();
                *local_108 = *local_108 + -1;
                UNLOCK();
                if (*local_108 == 0) {
                  if (local_f8 == (Allocator *)0x0) {
                    if (local_110 != (void *)0x0) {
                      free(*(void **)((long)local_110 + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_f8 + 8))();
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (this->super_ConvolutionDepthWise).group);
            goto LAB_001267eb;
          }
        }
      }
      else {
        if (bVar7 == 0) goto LAB_00126606;
        iVar17 = (this->super_ConvolutionDepthWise).stride_w;
        iVar15 = (this->super_ConvolutionDepthWise).stride_h;
        if (iVar15 == 1 && iVar17 == 1) {
          convdw3x3s1_sse(&local_158,local_120,
                          (Mat *)(this->super_ConvolutionDepthWise).weight_data.data,
                          (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,opt_00);
        }
        else {
          if (iVar15 != 2 || iVar17 != 2) goto LAB_00126606;
          convdw3x3s2_sse(&local_158,local_120,
                          (Mat *)(this->super_ConvolutionDepthWise).weight_data.data,
                          (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,opt_00);
        }
      }
LAB_001267e8:
      iVar17 = 0;
    }
  }
  else {
    copy_make_border(&local_70,&local_158,iVar9,iVar9,iVar16,iVar16,0,0.0,opt->workspace_allocator,
                     opt->num_threads);
LAB_00126068:
    iVar17 = -100;
    if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
      opt = local_118;
      top_blob = local_120;
      iVar17 = local_158.w;
      iVar15 = local_158.h;
      goto LAB_0012610c;
    }
  }
LAB_001267eb:
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(*(void **)((long)local_158.data - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_158.allocator + 8))();
      }
    }
  }
LAB_0012681f:
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        if (local_70.data != (void *)0x0) {
          free(*(void **)((long)local_70.data - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_70.allocator + 8))();
      }
    }
  }
  return iVar17;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_inference)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                {
                    if (stride_w == 1 && stride_h == 1)
                    {
                        convdw3x3s1_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }
                    else if (stride_w == 2 && stride_h == 2)
                    {
                        convdw3x3s2_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }

                    // dequantize, reverse scale inplace
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int g=0; g<group; g++)
                    {
                        ncnn::Option opt_g = opt;
                        opt_g.num_threads = 1;
                        opt_g.blob_allocator = top_blob.allocator;

                        Mat top_blob_g = top_blob.channel(g);
                        dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                    }

                    return 0;
                }
            }
        }
        else
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if (stride_w == 1 && stride_h == 1)
                {
                    convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
                else if (stride_w == 2 && stride_h == 2)
                {
                    convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

            // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        ncnn::Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}